

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O2

void __thiscall tst_helpers_map::sequenceTypes(tst_helpers_map *this)

{
  QSharedData *pQVar1;
  PromiseData<QList<QString>_> *pPVar2;
  ArrayOptions *pAVar3;
  QArrayDataPointer<QString> *this_00;
  long lVar4;
  initializer_list<int> __l;
  initializer_list<QString> args;
  initializer_list<int> __l_00;
  initializer_list<QString> args_00;
  PromiseResolver<QString> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_158;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_150;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_148;
  allocator_type local_139;
  QArrayDataPointer<QString> local_138;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_120;
  QArrayDataPointer<QString> local_118;
  Data *local_100;
  Data *local_f8;
  PromiseType p;
  PromiseResolver<QString> resolver;
  QArrayDataPointer<QString> local_c0;
  PromiseType p_1;
  vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_> promises;
  QString local_80;
  QString local_68;
  QString *local_50;
  QArrayDataPointer<char16_t> local_48;
  
  anon_unknown.dwarf_49bdd::SequenceTester<QList<int>_>::exec();
  anon_unknown.dwarf_49bdd::SequenceTester<QList<int>_>::exec();
  p_1.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase = (_func_int **)0x2b0000002a;
  p_1.super_QPromiseBase<QList<QString>_>.m_d.d._0_4_ = 0x2c;
  this_00 = &local_c0;
  __l._M_len = 3;
  __l._M_array = (iterator)&p_1;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)this_00,__l,(allocator_type *)&local_120);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = (Data *)&PTR__QPromiseBase_00127ac8;
  local_100 = (Data *)&PTR__QPromiseBase_00127a80;
  while (this_00 = (QArrayDataPointer<QString> *)
                   (((_List_base<int,_std::allocator<int>_> *)&this_00->d)->_M_impl)._M_node.
                   super__List_node_base._M_next, this_00 != &local_c0) {
    local_138.d = local_f8;
    pPVar2 = (PromiseData<QList<QString>_> *)operator_new(0x68);
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_error).m_data
    ._M_exception_object = (void *)0x0;
    (pPVar2->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_catchers).d.
    ptr = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
          0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_catchers).d.
    size = 0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_handlers).d.
    size = 0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_catchers).d.d
         = (Data *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_handlers).d.d
         = (Data *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_handlers).d.
    ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_lock = 0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_settled = 0;
    ((PromiseDataBase<QString,_void_(const_QString_&)> *)
    &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
    _vptr_PromiseDataBase = (_func_int **)0x0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
      super_QSharedData = 0;
    (pPVar2->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<QString>::PromiseData((PromiseData<QString> *)pPVar2);
    LOCK();
    pQVar1 = &((PromiseDataBase<QString,_void_(const_QString_&)> *)
              &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar2 != (PromiseData<QList<QString>_> *)0x0) {
      LOCK();
      pQVar1 = &((PromiseDataBase<QString,_void_(const_QString_&)> *)
                &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118.d = local_100;
    local_138.ptr = (QString *)pPVar2;
    local_118.ptr = (QString *)pPVar2;
    QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
              (&resolver,(QPromise<QString> *)&local_118);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_118);
    if (resolver.m_d.d == (Data *)0x0) {
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
           (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      resolver_1 = resolver;
    }
    local_148.d = (Data *)0x0;
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_150.d = (Data *)0x0;
    }
    else {
      LOCK();
      (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_150 = resolver_1.m_d.d;
    }
    local_158.d = (Data *)0x0;
    QString::number((int)&local_48,(int)this_00->size + 1);
    QtPromisePrivate::PromiseResolver<QString>::resolve<QString>
              ((PromiseResolver<QString> *)&resolver_1.m_d,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_150);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_158);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_148);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    local_138.d = local_100;
    std::vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>::
    emplace_back<QtPromise::QPromise<QString>>
              ((vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>> *)
               &promises,(QPromise<QString> *)&local_138);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_138);
  }
  QtPromise::all<QString,_std::vector,_std::allocator<QtPromise::QPromise<QString>_>_>
            ((QtPromise *)&p,&promises);
  std::vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>::~vector
            (&promises);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&local_c0);
  local_118.d = (Data *)0x0;
  local_118.ptr = (QString *)0x0;
  local_118.size = 0;
  waitForValue<QList<QString>>((QList<QString> *)&local_c0,&p,(QList<QString> *)&local_118);
  QString::QString((QString *)&promises,"43");
  QString::QString(&local_80,"44");
  QString::QString(&local_68,"45");
  args._M_len = 3;
  args._M_array = (iterator)&promises;
  QList<QString>::QList((QList<QString> *)&local_138,args);
  QTest::qCompare<QString>
            ((QList<QString> *)&local_c0,(QList<QString> *)&local_138,
             "waitForValue(p, QVector<QString>{})","(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x2c);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
  lVar4 = 0x30;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               ((long)&promises.
                       super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_c0);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_118);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase(&p.super_QPromiseBase<QList<QString>_>);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
       (Data *)0x2b0000002a;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&resolver;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_118,__l_00,&local_139);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = local_118.ptr;
  for (pAVar3 = (ArrayOptions *)local_118.d; (QString *)pAVar3 != local_50; pAVar3 = pAVar3 + 1) {
    p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase = (_func_int **)local_f8;
    pPVar2 = (PromiseData<QList<QString>_> *)operator_new(0x68);
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_error).m_data
    ._M_exception_object = (void *)0x0;
    (pPVar2->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_catchers).d.
    ptr = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
          0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_catchers).d.
    size = 0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_handlers).d.
    size = 0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_catchers).d.d
         = (Data *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_handlers).d.d
         = (Data *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_handlers).d.
    ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_lock = 0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->m_settled = 0;
    ((PromiseDataBase<QString,_void_(const_QString_&)> *)
    &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
    _vptr_PromiseDataBase = (_func_int **)0x0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
      super_QSharedData = 0;
    (pPVar2->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<QString>::PromiseData((PromiseData<QString> *)pPVar2);
    LOCK();
    pQVar1 = &((PromiseDataBase<QString,_void_(const_QString_&)> *)
              &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar2 != (PromiseData<QList<QString>_> *)0x0) {
      LOCK();
      pQVar1 = &((PromiseDataBase<QString,_void_(const_QString_&)> *)
                &pPVar2->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)->
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_138.d = local_100;
    local_138.ptr = (QString *)pPVar2;
    p.super_QPromiseBase<QList<QString>_>.m_d.d = pPVar2;
    QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
              ((PromiseResolver<QString> *)&resolver_1.m_d,(QPromise<QString> *)&local_138);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_138);
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_148.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_148 = resolver_1.m_d.d;
    }
    local_150.d = (Data *)0x0;
    if (local_148.d == (Data *)0x0) {
      local_158.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_148.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_158.d = local_148.d;
    }
    local_120.d = (Data *)0x0;
    QString::number((int)&local_c0,
                    (((QArrayData *)&pAVar3->i)->ref_)._q_value.super___atomic_base<int>._M_i + 1);
    QtPromisePrivate::PromiseResolver<QString>::resolve<QString>
              ((PromiseResolver<QString> *)&local_148,(QString *)&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_158);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_120);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_148);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_150);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase = (_func_int **)local_100;
    std::vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>::
    emplace_back<QtPromise::QPromise<QString>>
              ((vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>> *)
               &promises,(QPromise<QString> *)&p);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&p);
  }
  QtPromise::all<QString,_std::vector,_std::allocator<QtPromise::QPromise<QString>_>_>
            ((QtPromise *)&p_1,&promises);
  std::vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>::~vector
            (&promises);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_118);
  local_138.d = (Data *)0x0;
  local_138.ptr = (QString *)0x0;
  local_138.size = 0;
  waitForValue<QList<QString>>((QList<QString> *)&local_118,&p_1,(QList<QString> *)&local_138);
  QString::QString((QString *)&promises,"43");
  QString::QString(&local_80,"44");
  QString::QString(&local_68,"45");
  args_00._M_len = 3;
  args_00._M_array = (iterator)&promises;
  QList<QString>::QList((QList<QString> *)&p,args_00);
  QTest::qCompare<QString>
            ((QList<QString> *)&local_118,(QList<QString> *)&p,"waitForValue(p, QVector<QString>{})"
             ,"(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x2c);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&p);
  lVar4 = 0x30;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               ((long)&promises.
                       super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_118);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase(&p_1.super_QPromiseBase<QList<QString>_>);
  return;
}

Assistant:

void tst_helpers_map::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}